

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::Promise<int>_> * __thiscall
kj::arr<kj::Promise<int>,kj::Promise<int>>
          (Array<kj::Promise<int>_> *__return_storage_ptr__,kj *this,Promise<int> *param1,
          Promise<int> *params)

{
  Promise<int> *pPVar1;
  undefined1 local_40 [8];
  ArrayBuilder<kj::Promise<int>_> builder;
  Promise<int> *params_local;
  Promise<int> *param1_local;
  
  builder.disposer = (ArrayDisposer *)param1;
  heapArrayBuilder<kj::Promise<int>>
            ((ArrayBuilder<kj::Promise<int>_> *)local_40,(kj *)0x2,(size_t)param1);
  pPVar1 = fwd<kj::Promise<int>>((NoInfer<kj::Promise<int>_> *)this);
  ArrayBuilder<kj::Promise<int>>::add<kj::Promise<int>>
            ((ArrayBuilder<kj::Promise<int>> *)local_40,pPVar1);
  pPVar1 = fwd<kj::Promise<int>>((NoInfer<kj::Promise<int>_> *)builder.disposer);
  ArrayBuilder<kj::Promise<int>>::add<kj::Promise<int>>
            ((ArrayBuilder<kj::Promise<int>> *)local_40,pPVar1);
  ArrayBuilder<kj::Promise<int>_>::finish
            (__return_storage_ptr__,(ArrayBuilder<kj::Promise<int>_> *)local_40);
  ArrayBuilder<kj::Promise<int>_>::~ArrayBuilder((ArrayBuilder<kj::Promise<int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Array<Decay<T>> arr(T&& param1, Params&&... params) {
  ArrayBuilder<Decay<T>> builder = heapArrayBuilder<Decay<T>>(sizeof...(params) + 1);
  (builder.add(kj::fwd<T>(param1)), ... , builder.add(kj::fwd<Params>(params)));
  return builder.finish();
}